

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<TPZEqnArray<float>_>::ReallocForNuma(TPZVec<TPZEqnArray<float>_> *this)

{
  TPZEqnArray<float> *__dest;
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong *puVar3;
  long lVar4;
  long lVar5;
  TPZEqnArray<float> *pTVar6;
  ulong uVar7;
  
  uVar1 = this->fNElements;
  if ((uVar1 != 0) && (this->fStore != (TPZEqnArray<float> *)0x0)) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    uVar7 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x22f0),8) == 0) {
      uVar7 = SUB168(auVar2 * ZEXT816(0x22f0),0) | 8;
    }
    puVar3 = (ulong *)operator_new__(uVar7);
    *puVar3 = uVar1;
    __dest = (TPZEqnArray<float> *)(puVar3 + 1);
    lVar4 = 0;
    pTVar6 = __dest;
    do {
      TPZEqnArray<float>::TPZEqnArray(pTVar6);
      lVar4 = lVar4 + -0x22f0;
      pTVar6 = pTVar6 + 1;
    } while (uVar1 * -0x22f0 - lVar4 != 0);
    pTVar6 = this->fStore;
    memcpy(__dest,pTVar6,this->fNElements * 0x22f0);
    if (pTVar6 != (TPZEqnArray<float> *)0x0) {
      lVar4 = *(long *)&pTVar6[-1].fLastTerm;
      if (lVar4 != 0) {
        lVar5 = lVar4 * 0x22f0;
        do {
          TPZEqnArray<float>::~TPZEqnArray
                    ((TPZEqnArray<float> *)
                     ((long)pTVar6[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                     lVar5 + -0x28));
          lVar5 = lVar5 + -0x22f0;
        } while (lVar5 != 0);
      }
      operator_delete__(&pTVar6[-1].fLastTerm,lVar4 * 0x22f0 | 8);
    }
    this->fStore = __dest;
  }
  return;
}

Assistant:

void ReallocForNuma() {
        if (fNElements == 0 || fStore == NULL)
            return;
        T* newStore = new T[fNElements];
        memcpy((void*)newStore,(void*)fStore,fNElements*sizeof(T));
        delete [] fStore;
        fStore = newStore;
	}